

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,opj_tcd_t *p_tile_coder,OPJ_BYTE *p_data,
                          OPJ_UINT32 *p_data_written,OPJ_UINT32 total_data_size,
                          opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  bool bVar2;
  uint *puVar3;
  OPJ_BOOL OVar4;
  opj_tcd_marker_info_t *poVar5;
  OPJ_BYTE *pOVar6;
  ulong uVar7;
  char *pcVar8;
  byte bVar9;
  undefined8 uVar10;
  ulong uVar11;
  OPJ_BYTE *pOVar12;
  uint uVar13;
  OPJ_BYTE *p_buffer;
  OPJ_UINT32 p_value;
  ushort uVar14;
  ulong uVar15;
  byte local_65 [5];
  OPJ_BYTE *local_60;
  undefined8 local_58;
  OPJ_BYTE *local_50;
  uint *local_48;
  OPJ_BYTE *local_40;
  opj_tcd_marker_info_t *local_38;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12ba,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bb,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bc,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (total_data_size < 4) {
    pcVar8 = "Not enough bytes in output buffer to write SOD marker\n";
LAB_001219b8:
    opj_event_msg(p_manager,1,pcVar8);
    return 0;
  }
  opj_write_bytes_LE(p_data,0xff93,2);
  p_tile_coder->tp_num = (p_j2k->m_specific_param).m_decoder.m_state;
  p_tile_coder->cur_tp_num = (p_j2k->m_specific_param).m_encoder.m_current_tile_part_number;
  if ((p_j2k->m_specific_param).m_encoder.m_current_tile_part_number == 0) {
    p_tile_coder->tcd_image->tiles->packno = 0;
  }
  *p_data_written = 0;
  OVar4 = (p_j2k->m_specific_param).m_encoder.m_PLT;
  if (OVar4 == 0) {
    poVar5 = (opj_tcd_marker_info_t *)0x0;
  }
  else {
    poVar5 = opj_tcd_marker_info_create(OVar4);
    if (poVar5 == (opj_tcd_marker_info_t *)0x0) {
      pcVar8 = "Cannot encode tile: opj_tcd_marker_info_create() failed\n";
      goto LAB_001219b8;
    }
  }
  pOVar1 = &(p_j2k->m_specific_param).m_encoder.m_reserved_bytes_for_PLT;
  if (total_data_size - 4 < *pOVar1) {
    pcVar8 = "Not enough bytes in output buffer to write SOD marker\n";
  }
  else {
    local_40 = p_data;
    OVar4 = opj_tcd_encode_tile(p_tile_coder,p_j2k->m_current_tile_number,p_data + 2,p_data_written,
                                (total_data_size - 4) - *pOVar1,(opj_codestream_info_t *)0x0,poVar5,
                                p_manager);
    if (OVar4 != 0) {
      *p_data_written = *p_data_written + 2;
      if ((p_j2k->m_specific_param).m_encoder.m_PLT != 0) {
        pOVar6 = (OPJ_BYTE *)
                 opj_malloc((ulong)(p_j2k->m_specific_param).m_encoder.m_reserved_bytes_for_PLT);
        if (pOVar6 == (OPJ_BYTE *)0x0) {
          pcVar8 = "Cannot allocate memory\n";
          goto LAB_00121c36;
        }
        pOVar12 = pOVar6 + 2;
        local_48 = p_data_written;
        opj_write_bytes_LE(pOVar6,0xff58,2);
        opj_write_bytes_LE(pOVar6 + 4,0,1);
        p_buffer = pOVar6 + 5;
        if (poVar5->packet_count == 0) {
          p_value = 3;
        }
        else {
          local_60 = pOVar12;
          local_50 = pOVar6;
          uVar14 = 3;
          uVar15 = 0;
          local_38 = poVar5;
          uVar10 = 0;
          do {
            uVar13 = local_38->p_packet_size[uVar15];
            local_65[0] = (byte)uVar13 & 0x7f;
            uVar7 = 1;
            if (0x7f < uVar13) {
              uVar7 = 1;
              do {
                local_65[uVar7] = (byte)(uVar13 >> 7) | 0x80;
                uVar7 = uVar7 + 1;
                bVar2 = 0x3fff < uVar13;
                uVar13 = uVar13 >> 7;
              } while (bVar2);
            }
            uVar7 = uVar7 & 0xff;
            uVar11 = uVar7;
            if ((int)uVar7 + (uint)uVar14 < 0x10000) {
              local_58 = uVar10;
LAB_00121bc0:
              do {
                opj_write_bytes_LE(p_buffer,(uint)local_65[(int)uVar11 - 1],1);
                p_buffer = p_buffer + 1;
                uVar11 = uVar11 - 1;
              } while ((char)uVar11 != '\0');
              uVar14 = (short)uVar7 + uVar14;
              bVar2 = true;
            }
            else {
              if ((char)uVar10 != -1) {
                opj_write_bytes_LE(local_60,(uint)uVar14,2);
                opj_write_bytes_LE(p_buffer,0xff58,2);
                local_60 = p_buffer + 2;
                bVar9 = (char)uVar10 + 1;
                local_58 = CONCAT71((int7)((ulong)uVar10 >> 8),bVar9);
                opj_write_bytes_LE(p_buffer + 4,(uint)bVar9,1);
                p_buffer = p_buffer + 5;
                uVar14 = 3;
                goto LAB_00121bc0;
              }
              bVar2 = false;
              local_58 = uVar10;
              opj_event_msg(p_manager,1,
                            "More than 255 PLT markers would be needed for current tile-part !\n");
            }
            pOVar6 = local_50;
            poVar5 = local_38;
            if (!bVar2) {
              bVar2 = true;
              uVar13 = 0;
              goto LAB_00121c99;
            }
            uVar15 = uVar15 + 1;
            uVar10 = local_58;
          } while (uVar15 < local_38->packet_count);
          p_value = (OPJ_UINT32)uVar14;
          pOVar12 = local_60;
        }
        uVar13 = (int)p_buffer - (int)pOVar6;
        opj_write_bytes_LE(pOVar12,p_value,2);
        bVar2 = false;
LAB_00121c99:
        pOVar12 = local_40;
        puVar3 = local_48;
        if (bVar2) {
          opj_tcd_marker_info_destroy(poVar5);
          opj_free(pOVar6);
          return 0;
        }
        if ((p_j2k->m_specific_param).m_encoder.m_reserved_bytes_for_PLT < uVar13) {
          __assert_fail("l_data_written_PLT <= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x132d,
                        "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                       );
        }
        memmove(local_40 + uVar13,local_40,(ulong)*local_48);
        memcpy(pOVar12,pOVar6,(ulong)uVar13);
        opj_free(pOVar6);
        *puVar3 = *puVar3 + uVar13;
      }
      opj_tcd_marker_info_destroy(poVar5);
      return 1;
    }
    pcVar8 = "Cannot encode tile\n";
  }
LAB_00121c36:
  opj_event_msg(p_manager,1,pcVar8);
  opj_tcd_marker_info_destroy(poVar5);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,
                                  opj_tcd_t * p_tile_coder,
                                  OPJ_BYTE * p_data,
                                  OPJ_UINT32 * p_data_written,
                                  OPJ_UINT32 total_data_size,
                                  const opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_codestream_info_t *l_cstr_info = 00;
    OPJ_UINT32 l_remaining_data;
    opj_tcd_marker_info_t* marker_info = NULL;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);

    if (total_data_size < 4) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, J2K_MS_SOD,
                    2);                                 /* SOD */

    /* make room for the EOF marker */
    l_remaining_data =  total_data_size - 4;

    /* update tile coder */
    p_tile_coder->tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number ;
    p_tile_coder->cur_tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;

    /* INDEX >> */
    /* TODO mergeV2: check this part which use cstr_info */
    /*l_cstr_info = p_j2k->cstr_info;
    if (l_cstr_info) {
            if (!p_j2k->m_specific_param.m_encoder.m_current_tile_part_number ) {
                    //TODO cstr_info->tile[p_j2k->m_current_tile_number].end_header = p_stream_tell(p_stream) + p_j2k->pos_correction - 1;
                    l_cstr_info->tile[p_j2k->m_current_tile_number].tileno = p_j2k->m_current_tile_number;
            }
            else {*/
    /*
    TODO
    if
            (cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno - 1].end_pos < p_stream_tell(p_stream))
    {
            cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno].start_pos = p_stream_tell(p_stream);
    }*/
    /*}*/
    /* UniPG>> */
#ifdef USE_JPWL
    /* update markers struct */
    /*OPJ_BOOL res = j2k_add_marker(p_j2k->cstr_info, J2K_MS_SOD, p_j2k->sod_start, 2);
    */
    assert(0 && "TODO");
#endif /* USE_JPWL */
    /* <<UniPG */
    /*}*/
    /* << INDEX */

    if (p_j2k->m_specific_param.m_encoder.m_current_tile_part_number == 0) {
        p_tile_coder->tcd_image->tiles->packno = 0;
#ifdef deadcode
        if (l_cstr_info) {
            l_cstr_info->packno = 0;
        }
#endif
    }

    *p_data_written = 0;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        marker_info = opj_tcd_marker_info_create(
                          p_j2k->m_specific_param.m_encoder.m_PLT);
        if (marker_info == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Cannot encode tile: opj_tcd_marker_info_create() failed\n");
            return OPJ_FALSE;
        }
    }

    if (l_remaining_data <
            p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }
    l_remaining_data -= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT;

    if (! opj_tcd_encode_tile(p_tile_coder, p_j2k->m_current_tile_number,
                              p_data + 2,
                              p_data_written, l_remaining_data, l_cstr_info,
                              marker_info,
                              p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Cannot encode tile\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }

    /* For SOD */
    *p_data_written += 2;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        OPJ_UINT32 l_data_written_PLT = 0;
        OPJ_BYTE* p_PLT_buffer = (OPJ_BYTE*)opj_malloc(
                                     p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);
        if (!p_PLT_buffer) {
            opj_event_msg(p_manager, EVT_ERROR, "Cannot allocate memory\n");
            opj_tcd_marker_info_destroy(marker_info);
            return OPJ_FALSE;
        }
        if (!opj_j2k_write_plt_in_memory(p_j2k,
                                         marker_info,
                                         p_PLT_buffer,
                                         &l_data_written_PLT,
                                         p_manager)) {
            opj_tcd_marker_info_destroy(marker_info);
            opj_free(p_PLT_buffer);
            return OPJ_FALSE;
        }

        assert(l_data_written_PLT <=
               p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);

        /* Move PLT marker(s) before SOD */
        memmove(p_data + l_data_written_PLT, p_data, *p_data_written);
        memcpy(p_data, p_PLT_buffer, l_data_written_PLT);
        opj_free(p_PLT_buffer);
        *p_data_written += l_data_written_PLT;
    }

    opj_tcd_marker_info_destroy(marker_info);

    return OPJ_TRUE;
}